

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_small_type_uses.cpp
# Opt level: O2

spv_result_t spvtools::val::ValidateSmallTypeUses(ValidationState_t *_,Instruction *inst)

{
  ushort uVar1;
  uint32_t id;
  bool bVar2;
  pointer ppVar3;
  uint uVar4;
  DiagnosticStream local_1f0;
  
  bVar2 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,CapabilityShader);
  if ((((bVar2) && (id = (inst->inst_).type_id, id != 0)) &&
      (bVar2 = ValidationState_t::ContainsLimitedUseIntOrFloatType(_,id), bVar2)) &&
     (bVar2 = ValidationState_t::IsPointerType(_,(inst->inst_).type_id), !bVar2)) {
    for (ppVar3 = (inst->uses_).
                  super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        ppVar3 != (inst->uses_).
                  super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; ppVar3 = ppVar3 + 1) {
      uVar1 = (ppVar3->first->inst_).opcode;
      uVar4 = uVar1 - 0x3e;
      if (((0x35 < uVar4) || ((0x38000000200201U >> ((ulong)uVar4 & 0x3f) & 1) == 0)) &&
         (uVar1 != 0x14c)) {
        ValidationState_t::diag(&local_1f0,_,SPV_ERROR_INVALID_ID,ppVar3->first);
        std::operator<<((ostream *)&local_1f0,"Invalid use of 8- or 16-bit result");
        DiagnosticStream::~DiagnosticStream(&local_1f0);
        return local_1f0.error_;
      }
    }
  }
  return SPV_SUCCESS;
}

Assistant:

spv_result_t ValidateSmallTypeUses(ValidationState_t& _,
                                   const Instruction* inst) {
  if (!_.HasCapability(spv::Capability::Shader) || inst->type_id() == 0 ||
      !_.ContainsLimitedUseIntOrFloatType(inst->type_id())) {
    return SPV_SUCCESS;
  }

  if (_.IsPointerType(inst->type_id())) return SPV_SUCCESS;

  // The validator should previously have checked ways to generate 8- or 16-bit
  // types. So we only need to considervalid paths from source to sink.
  // When restricted, uses of 8- or 16-bit types can only be stores,
  // width-only conversions, decorations and copy object.
  for (auto use : inst->uses()) {
    const auto* user = use.first;
    switch (user->opcode()) {
      case spv::Op::OpDecorate:
      case spv::Op::OpDecorateId:
      case spv::Op::OpCopyObject:
      case spv::Op::OpStore:
      case spv::Op::OpFConvert:
      case spv::Op::OpUConvert:
      case spv::Op::OpSConvert:
        break;
      default:
        return _.diag(SPV_ERROR_INVALID_ID, user)
               << "Invalid use of 8- or 16-bit result";
    }
  }

  return SPV_SUCCESS;
}